

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O3

long __thiscall
gl4cts::anon_unknown_0::ImageLoadStoreDataAlignmentTest::Run(ImageLoadStoreDataAlignmentTest *this)

{
  GLuint *out_texture_id;
  CallLogWrapper *this_00;
  GLuint *out_texture_id_00;
  GLuint GVar1;
  GLuint GVar2;
  pointer puVar3;
  char cVar4;
  GLenum GVar5;
  GLuint index;
  int iVar6;
  ulong uVar7;
  long lVar8;
  InternalError *this_01;
  undefined1 auVar9 [8];
  ulong uVar10;
  _Elt_pointer pTVar11;
  vector<unsigned_char,_std::allocator<unsigned_char>_> left_texture_data;
  _Map_pointer local_1f8;
  _Elt_pointer local_1f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1d8;
  undefined1 local_1b8 [8];
  _func_int **pp_Stack_1b0;
  pointer local_1a8;
  ios_base local_140 [272];
  
  pTVar11 = (this->m_texture_dimensions).
            super__Deque_base<gl4cts::(anonymous_namespace)::ImageLoadStoreDataAlignmentTest::TextureDimensions,_std::allocator<gl4cts::(anonymous_namespace)::ImageLoadStoreDataAlignmentTest::TextureDimensions>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  lVar8 = 0;
  if ((this->m_texture_dimensions).
      super__Deque_base<gl4cts::(anonymous_namespace)::ImageLoadStoreDataAlignmentTest::TextureDimensions,_std::allocator<gl4cts::(anonymous_namespace)::ImageLoadStoreDataAlignmentTest::TextureDimensions>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur != pTVar11) {
    local_1f0 = (this->m_texture_dimensions).
                super__Deque_base<gl4cts::(anonymous_namespace)::ImageLoadStoreDataAlignmentTest::TextureDimensions,_std::allocator<gl4cts::(anonymous_namespace)::ImageLoadStoreDataAlignmentTest::TextureDimensions>_>
                ._M_impl.super__Deque_impl_data._M_start._M_last;
    local_1f8 = (this->m_texture_dimensions).
                super__Deque_base<gl4cts::(anonymous_namespace)::ImageLoadStoreDataAlignmentTest::TextureDimensions,_std::allocator<gl4cts::(anonymous_namespace)::ImageLoadStoreDataAlignmentTest::TextureDimensions>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
    out_texture_id = &this->m_destination_texture_id;
    out_texture_id_00 = &this->m_source_texture_id;
    this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    cVar4 = '\x01';
    do {
      GVar1 = pTVar11->m_width;
      GVar2 = pTVar11->m_height;
      uVar10 = (ulong)(GVar2 * GVar1);
      local_1b8 = (undefined1  [8])0x0;
      pp_Stack_1b0 = (_func_int **)0x0;
      local_1a8 = (pointer)0x0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b8,uVar10);
      if (uVar10 != 0) {
        uVar7 = 0;
        do {
          *(uchar *)((long)(qpTestLog **)local_1b8 + uVar7) = '\0';
          uVar7 = uVar7 + 1;
        } while (uVar10 != uVar7);
      }
      GVar5 = Create2DR8UITexture(this,GVar1,GVar2,
                                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b8
                                  ,out_texture_id);
      if (local_1b8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_1b8,(long)local_1a8 - (long)local_1b8);
      }
      glu::checkError(GVar5,"Create2DR8UIDestinationTexture",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                      ,0x1a8d);
      GVar1 = pTVar11->m_width;
      GVar2 = pTVar11->m_height;
      uVar10 = (ulong)(GVar2 * GVar1);
      local_1b8 = (undefined1  [8])0x0;
      pp_Stack_1b0 = (_func_int **)0x0;
      local_1a8 = (pointer)0x0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b8,uVar10);
      if (uVar10 != 0) {
        uVar7 = 0;
        do {
          *(uchar *)((long)(qpTestLog **)local_1b8 + uVar7) = (uchar)uVar7;
          uVar7 = uVar7 + 1;
        } while (uVar10 != uVar7);
      }
      GVar5 = Create2DR8UITexture(this,GVar1,GVar2,
                                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b8
                                  ,out_texture_id_00);
      if (local_1b8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_1b8,(long)local_1a8 - (long)local_1b8);
      }
      glu::checkError(GVar5,"Create2DR8UISourceTexture",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                      ,0x1a8f);
      GVar1 = this->m_destination_texture_id;
      GVar2 = this->m_source_texture_id;
      glu::CallLogWrapper::glUseProgram(this_00,this->m_program_id);
      GVar5 = glu::CallLogWrapper::glGetError(this_00);
      glu::checkError(GVar5,"UseProgram",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                      ,0x1b0e);
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array_object_id);
      GVar5 = glu::CallLogWrapper::glGetError(this_00);
      glu::checkError(GVar5,"BindVertexArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                      ,0x1b12);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vertex_buffer_id);
      GVar5 = glu::CallLogWrapper::glGetError(this_00);
      glu::checkError(GVar5,"BindBuffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                      ,0x1b16);
      index = glu::CallLogWrapper::glGetAttribLocation(this_00,this->m_program_id,"vs_in_position");
      GVar5 = glu::CallLogWrapper::glGetError(this_00);
      glu::checkError(GVar5,"GetAttribLocation",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                      ,0x1b1a);
      if (index == 0xffffffff) {
        this_01 = (InternalError *)__cxa_allocate_exception(0x38);
        tcu::InternalError::InternalError
                  (this_01,"Attribute location is not available","vs_in_position",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                   ,0x1b1e);
        __cxa_throw(this_01,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
      }
      glu::CallLogWrapper::glVertexAttribPointer(this_00,index,4,0x1406,'\0',0,(void *)0x0);
      GVar5 = glu::CallLogWrapper::glGetError(this_00);
      glu::checkError(GVar5,"VertexAttribPointer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                      ,0x1b23);
      glu::CallLogWrapper::glEnableVertexAttribArray(this_00,index);
      GVar5 = glu::CallLogWrapper::glGetError(this_00);
      glu::checkError(GVar5,"EnableVertexAttribArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                      ,0x1b26);
      BindTextureToImage(this,this->m_program_id,GVar1,0,"u_destination_image");
      BindTextureToImage(this,this->m_program_id,GVar2,1,"u_source_image");
      glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
      GVar5 = glu::CallLogWrapper::glGetError(this_00);
      glu::checkError(GVar5,"DrawArrays",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                      ,0x1b2e);
      GVar1 = this->m_destination_texture_id;
      GVar2 = this->m_source_texture_id;
      uVar10 = (ulong)(pTVar11->m_height * pTVar11->m_width);
      local_1a8 = (pointer)0x0;
      local_1b8 = (undefined1  [8])0x0;
      pp_Stack_1b0 = (_func_int **)0x0;
      local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b8,uVar10);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_1d8,uVar10);
      glu::CallLogWrapper::glBindTexture(this_00,0xde1,GVar1);
      GVar5 = glu::CallLogWrapper::glGetError(this_00);
      glu::checkError(GVar5,"BindTexture",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                      ,0x1aea);
      glu::CallLogWrapper::glGetTexImage(this_00,0xde1,0,0x8d94,0x1401,(void *)local_1b8);
      GVar5 = glu::CallLogWrapper::glGetError(this_00);
      glu::checkError(GVar5,"GetTexImage",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                      ,0x1aed);
      glu::CallLogWrapper::glBindTexture(this_00,0xde1,GVar2);
      GVar5 = glu::CallLogWrapper::glGetError(this_00);
      glu::checkError(GVar5,"BindTexture",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                      ,0x1af1);
      glu::CallLogWrapper::glGetTexImage
                (this_00,0xde1,0,0x8d94,0x1401,
                 local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start);
      GVar5 = glu::CallLogWrapper::glGetError(this_00);
      glu::checkError(GVar5,"GetTexImage",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                      ,0x1af4);
      auVar9 = local_1b8;
      puVar3 = local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar6 = bcmp((void *)local_1b8,
                   local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,uVar10);
      if (puVar3 != (pointer)0x0) {
        operator_delete(puVar3,(long)local_1d8.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)puVar3);
        auVar9 = local_1b8;
      }
      if (auVar9 != (undefined1  [8])0x0) {
        operator_delete((void *)auVar9,(long)local_1a8 - (long)auVar9);
      }
      if (iVar6 != 0) {
        local_1b8 = (undefined1  [8])
                    ((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                    m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_1b0,
                   "Copy with imageLoad and imageStore failed for textures: ",0x38);
        std::ostream::_M_insert<unsigned_long>((ulong)&pp_Stack_1b0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,"x",1);
        std::ostream::_M_insert<unsigned_long>((ulong)&pp_Stack_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_1b0,". Source and destination textures are different",0x2f);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
        std::ios_base::~ios_base(local_140);
        cVar4 = '\0';
      }
      glu::CallLogWrapper::glDeleteTextures(this_00,1,out_texture_id);
      glu::CallLogWrapper::glDeleteTextures(this_00,1,out_texture_id_00);
      *out_texture_id = 0;
      *out_texture_id_00 = 0;
      pTVar11 = pTVar11 + 1;
      if (pTVar11 == local_1f0) {
        pTVar11 = local_1f8[1];
        local_1f8 = local_1f8 + 1;
        local_1f0 = pTVar11 + 0x40;
      }
    } while ((this->m_texture_dimensions).
             super__Deque_base<gl4cts::(anonymous_namespace)::ImageLoadStoreDataAlignmentTest::TextureDimensions,_std::allocator<gl4cts::(anonymous_namespace)::ImageLoadStoreDataAlignmentTest::TextureDimensions>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur != pTVar11);
    lVar8 = (long)(char)(cVar4 + -1);
  }
  return lVar8;
}

Assistant:

bool SupportedInStage(int stage, int required)
	{
		switch (stage)
		{
		case 0:
			return SupportedInVS(required);
		case 1:
			return SupportedInTCS(required);
		case 2:
			return SupportedInTES(required);
		case 3:
			return SupportedInGS(required);
		default:
			return true;
		}
	}